

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

void __thiscall duckdb::QueryProfiler::WriteToFile(QueryProfiler *this,char *path,string *info)

{
  byte bVar1;
  string *msg;
  int *piVar2;
  IOException *this_00;
  string *in_RDX;
  char *in_RSI;
  ofstream out;
  allocator local_249;
  string local_248 [48];
  ostream local_218 [512];
  string *local_18;
  
  local_18 = in_RDX;
  ::std::ofstream::ofstream(local_218,in_RSI,_S_out);
  ::std::operator<<(local_218,local_18);
  ::std::ofstream::close();
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    ::std::ofstream::~ofstream(local_218);
    return;
  }
  msg = (string *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  this_00 = (IOException *)strerror(*piVar2);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_248,(char *)this_00,&local_249);
  IOException::IOException(this_00,msg);
  __cxa_throw(msg,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void QueryProfiler::WriteToFile(const char *path, string &info) const {
	ofstream out(path);
	out << info;
	out.close();
	// throw an IO exception if it fails to write the file
	if (out.fail()) {
		throw IOException(strerror(errno));
	}
}